

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O3

bool trt_pose::parse::munkresStep3
               (float *cost_graph,int M,PairGraph *star_graph,PairGraph *prime_graph,
               CoverTable *cover_table,pair<int,_int> *p,int nrows,int ncols)

{
  ulong *puVar1;
  uint uVar2;
  _Bit_type *p_Var3;
  _Bit_type *p_Var4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  
  if (0 < nrows) {
    bVar14 = true;
    uVar12 = 0;
    do {
      if (0 < ncols) {
        p_Var3 = (cover_table->rows).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        p_Var4 = (cover_table->cols).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        uVar11 = uVar12 >> 6 & 0x3ffffff;
        uVar13 = 1L << ((byte)uVar12 & 0x3f);
        piVar5 = (prime_graph->rows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (prime_graph->cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (star_graph->rows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = 0;
        do {
          if ((((cost_graph[uVar10] == 0.0) && (!NAN(cost_graph[uVar10]))) &&
              (uVar8 = p_Var3[uVar11], (uVar8 & uVar13) == 0)) &&
             ((p_Var4[uVar10 >> 6 & 0x3ffffff] >> (uVar10 & 0x3f) & 1) == 0)) {
            piVar5[uVar12] = (int)uVar10;
            piVar6[uVar10] = (int)uVar12;
            uVar2 = piVar7[uVar12];
            if ((int)uVar2 < 0) {
              p->first = (int)uVar12;
              p->second = (int)uVar10;
              return bVar14;
            }
            p_Var3[uVar11] = uVar8 | uVar13;
            bVar9 = (byte)uVar2 & 0x3f;
            puVar1 = p_Var4 + (uVar2 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
          }
          uVar10 = uVar10 + 1;
        } while ((uint)ncols != uVar10);
      }
      uVar12 = uVar12 + 1;
      bVar14 = uVar12 < (uint)nrows;
      cost_graph = cost_graph + M;
    } while (uVar12 != (uint)nrows);
  }
  return false;
}

Assistant:

bool munkresStep3(const float *cost_graph, const int M,
                  const PairGraph &star_graph, PairGraph &prime_graph,
                  CoverTable &cover_table, std::pair<int, int> &p,
                  const int nrows, const int ncols) {
  for (int i = 0; i < nrows; i++) {
    for (int j = 0; j < ncols; j++) {
      if (cost_graph[i * M + j] == 0 && !cover_table.isCovered(i, j)) {
        prime_graph.set(i, j);
        if (star_graph.isRowSet(i)) {
          cover_table.coverRow(i);
          cover_table.uncoverCol(star_graph.colForRow(i));
        } else {
          p.first = i;
          p.second = j;
          return 1;
        }
      }
    }
  }
  return 0;
}